

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ChainPromiseNode::~ChainPromiseNode(ChainPromiseNode *this)

{
  ChainPromiseNode *this_local;
  
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&this->inner);
  Event::~Event(&this->super_Event);
  PromiseNode::~PromiseNode(&this->super_PromiseNode);
  return;
}

Assistant:

ChainPromiseNode::~ChainPromiseNode() noexcept(false) {}